

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

void N_VConst_ManyVector(sunrealtype c,N_Vector z)

{
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    N_VConst(in_XMM0_Qa,*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_20 * 8));
  }
  return;
}

Assistant:

void MVAPPEND(N_VConst)(sunrealtype c, N_Vector z)
{
  SUNFunctionBegin(z->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(z); i++)
  {
    N_VConst(c, MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}